

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

string * __thiscall
Corrade::Utility::String::Implementation::joinWithoutEmptyParts
          (string *__return_storage_ptr__,Implementation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strings,ArrayView<const_char> delimiter)

{
  string *psVar1;
  long lVar2;
  BasicStringView<const_char> *pBVar3;
  ulong uVar4;
  long lVar5;
  unsigned_long i;
  StringView SVar6;
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  stringViews;
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  local_b0;
  string *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  char *local_88;
  String local_80;
  BasicStringView<const_char> local_68;
  StringIterable local_58;
  
  local_88 = delimiter._data;
  uVar4 = *(long *)(this + 8) - *(long *)this >> 5;
  lVar2 = *(long *)(this + 8) - *(long *)this;
  local_98 = __return_storage_ptr__;
  local_90 = strings;
  if (lVar2 == 0) {
    local_b0._data = (BasicStringView<const_char> *)0x0;
  }
  else {
    local_b0._data =
         (BasicStringView<const_char> *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | lVar2 >> 1);
    pBVar3 = local_b0._data;
    do {
      pBVar3->_data = (char *)0x0;
      pBVar3->_sizePlusFlags = 0x8000000000000000;
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != local_b0._data + uVar4);
  }
  local_b0._deleter = (_func_void_BasicStringView<const_char>_ptr_unsigned_long *)0x0;
  lVar2 = *(long *)this;
  local_b0._size = uVar4;
  if (*(long *)(this + 8) != lVar2) {
    lVar5 = 0;
    i = 0;
    do {
      SVar6 = Containers::Implementation::
              StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::from((string *)(lVar2 + lVar5));
      pBVar3 = Containers::
               Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
               ::operator[]<unsigned_long,_0>(&local_b0,i);
      pBVar3->_data = SVar6._data;
      pBVar3->_sizePlusFlags = SVar6._sizePlusFlags;
      i = i + 1;
      lVar2 = *(long *)this;
      lVar5 = lVar5 + 0x20;
    } while (i != *(long *)(this + 8) - lVar2 >> 5);
  }
  Containers::BasicStringView<const_char>::BasicStringView
            (&local_68,(char *)local_90,(size_t)local_88,(StringViewFlags)0x0);
  Containers::StringIterable::StringIterable(&local_58,local_b0._data,local_b0._size);
  Containers::BasicStringView<const_char>::joinWithoutEmptyParts(&local_80,&local_68,&local_58);
  psVar1 = local_98;
  Containers::Implementation::
  StringConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::to(local_98,&local_80);
  Containers::String::~String(&local_80);
  Containers::
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  ::~Array(&local_b0);
  return psVar1;
}

Assistant:

std::string joinWithoutEmptyParts(const std::vector<std::string>& strings, const Containers::ArrayView<const char> delimiter) {
    /* IDGAF that this has two extra allocations due to the Array being created
       and then the String converted to a std::string vector, the input
       std::string instances are MUCH worse */
    Containers::Array<Containers::StringView> stringViews{strings.size()};
    for(std::size_t i = 0; i != strings.size(); ++i)
        stringViews[i] = strings[i];
    return Containers::StringView{delimiter}.joinWithoutEmptyParts(stringViews);
}